

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::rangeToString<Color_const*,Color_const*>
          (string *__return_storage_ptr__,Detail *this,Color *first,Color *last)

{
  Detail *value;
  ostream *poVar1;
  ReusableStringStream rss;
  ReusableStringStream RStack_68;
  type local_50;
  
  ReusableStringStream::ReusableStringStream(&RStack_68);
  poVar1 = RStack_68.m_oss;
  std::operator<<(RStack_68.m_oss,"{ ");
  if (this != (Detail *)first) {
    convertUnstreamable<Color>(&local_50,(Color *)this);
    std::operator<<(poVar1,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    for (value = this + 4; value != (Detail *)first; value = value + 4) {
      std::operator<<(poVar1,", ");
      convertUnstreamable<Color>(&local_50,(Color *)value);
      poVar1 = RStack_68.m_oss;
      std::operator<<(RStack_68.m_oss,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::operator<<(poVar1," }");
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&RStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }